

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

deque<cs_impl::any,_std::allocator<cs_impl::any>_> *
cs_impl::
try_convert_and_check<const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
::convert(var *val)

{
  bool bVar1;
  type_info *this;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar2;
  runtime_error *this_00;
  char *name;
  string sStack_118;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = any::type(val);
  bVar1 = std::type_info::operator==
                    (this,(type_info *)
                          &std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo);
  if (bVar1) {
    pdVar2 = any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(val);
    return pdVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_d8,1);
  std::operator+(&local_b8,"Invalid Argument. At ",&local_d8);
  std::operator+(&local_98,&local_b8,". Expected ");
  cxx_demangle_abi_cxx11_(&local_f8,(cs_impl *)"St5dequeIN7cs_impl3anyESaIS1_EE",name);
  std::operator+(&local_78,&local_98,&local_f8);
  std::operator+(&local_58,&local_78,", provided ");
  any::get_type_name_abi_cxx11_(&sStack_118,val);
  std::operator+(&local_38,&local_58,&sStack_118);
  cs::runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

inline static _TargetT convert(cs::var &val)
		{
			if (val.type() == typeid(_TargetT))
				return convert_helper<_TargetT>::get_val(val);
			else
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<_TargetT>()) + ", provided " +
				                        val.get_type_name());
		}